

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawRectangleRoundedLinesEx
               (Rectangle rec,float roundness,int segments,float lineThick,Color color)

{
  float fVar1;
  float fVar2;
  uchar y;
  uchar z;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar x;
  int k_1;
  int iVar5;
  ulong uVar6;
  int k;
  long lVar7;
  uchar w;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float __x;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float y_00;
  float fVar15;
  Rectangle rec_00;
  Vector2 point [16];
  Vector2 centers [4];
  float local_17c;
  float local_178;
  float fStack_174;
  float local_168;
  undefined1 local_128 [16];
  float local_c8 [4];
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58 [10];
  
  local_88 = rec.width;
  local_74 = rec.height;
  local_68 = rec.x;
  local_94 = rec.y;
  fVar13 = 0.0;
  if (0.0 <= lineThick) {
    fVar13 = lineThick;
  }
  if (0.0 < roundness) {
    fVar15 = 1.0;
    if (roundness <= 1.0) {
      fVar15 = roundness;
    }
    fVar8 = local_74;
    if (local_88 <= local_74) {
      fVar8 = local_88;
    }
    fVar15 = fVar8 * fVar15 * 0.5;
    if (0.0 < fVar15) {
      y = color.g;
      z = color.b;
      if (segments < 4) {
        fVar8 = 1.0 - 0.5 / fVar15;
        fVar8 = fVar8 * fVar8;
        local_128._8_4_ = in_XMM1_Dc;
        local_128._0_8_ = rec._8_8_;
        local_128._12_4_ = in_XMM1_Dd;
        fVar8 = acosf(fVar8 + fVar8 + -1.0);
        fVar8 = ceilf(6.2831855 / fVar8);
        segments = 4;
        if (0 < (int)(fVar8 * 0.5)) {
          segments = (int)(fVar8 * 0.5);
        }
      }
      fVar8 = fVar15 + fVar13;
      fVar9 = local_68 + fVar15;
      y_00 = local_94 - fVar13;
      local_88 = local_88 + local_68;
      fVar14 = local_88 - fVar15;
      local_c8[0] = local_88 + fVar13;
      local_c8[1] = local_94 + fVar15;
      local_74 = local_94 + local_74;
      local_c8[3] = local_74 - fVar15;
      local_b4 = local_74 + fVar13;
      local_a8 = local_68 - fVar13;
      w = color.a;
      x = color.r;
      local_c8[2] = local_c8[0];
      local_b8 = fVar14;
      local_b0 = fVar9;
      local_ac = local_b4;
      local_a4 = local_c8[3];
      local_a0 = local_a8;
      local_9c = local_c8[1];
      local_98 = fVar9;
      local_90 = fVar14;
      local_8c = local_94;
      local_84 = local_c8[1];
      local_80 = local_88;
      local_7c = local_c8[3];
      local_78 = fVar14;
      local_70 = fVar9;
      local_6c = local_74;
      local_64 = local_c8[3];
      local_60 = local_68;
      local_5c = local_c8[1];
      local_58[0] = fVar9;
      local_58[1] = local_c8[1];
      local_58[2] = fVar14;
      local_58[3] = local_c8[1];
      local_58[4] = fVar14;
      local_58[5] = local_c8[3];
      local_58[6] = fVar9;
      local_58[7] = local_c8[3];
      if (fVar13 <= 1.0) {
        rlBegin(1);
        lVar7 = 0;
        do {
          if (0 < segments) {
            fVar13 = local_58[lVar7 * 2];
            fVar15 = local_58[lVar7 * 2 + 1];
            local_128._0_4_ = (&DAT_001e8320)[lVar7];
            iVar5 = segments;
            do {
              rlColor4ub(x,y,z,w);
              fVar9 = cosf((float)local_128._0_4_ * 0.017453292);
              fVar14 = sinf((float)local_128._0_4_ * 0.017453292);
              rlVertex2f(fVar9 * fVar8 + fVar13,fVar14 * fVar8 + fVar15);
              fVar9 = (float)local_128._0_4_ + 90.0 / (float)segments;
              local_128._0_4_ = fVar9;
              fVar9 = fVar9 * 0.017453292;
              fVar14 = cosf(fVar9);
              fVar9 = sinf(fVar9);
              rlVertex2f(fVar14 * fVar8 + fVar13,fVar9 * fVar8 + fVar15);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        uVar6 = 0xfffffffffffffffe;
        do {
          rlColor4ub(x,y,z,w);
          rlVertex2f(local_c8[uVar6 * 2],local_c8[uVar6 * 2 + 1]);
          rlVertex2f(local_c8[uVar6 * 2 + 2],local_c8[uVar6 * 2 + 3]);
          uVar6 = uVar6 + 2;
        } while (uVar6 < 6);
        rlEnd();
      }
      else {
        rlSetTexture(texShapes.id);
        uVar4 = texShapesRec._8_8_;
        uVar3 = texShapesRec._0_8_;
        fVar13 = texShapesRec.y;
        rlBegin(7);
        local_178 = (float)uVar4;
        fStack_174 = SUB84(uVar4,4);
        local_168 = (float)uVar3;
        local_178 = local_178 + local_168;
        fStack_174 = fStack_174 + fVar13;
        lVar7 = 0;
        do {
          if (0 < segments) {
            fVar1 = local_58[lVar7 * 2];
            fVar2 = local_58[lVar7 * 2 + 1];
            local_17c = (float)(&DAT_001e8320)[lVar7];
            iVar5 = segments;
            do {
              rlColor4ub(x,y,z,w);
              rlTexCoord2f(local_168 / (float)texShapes.width,fVar13 / (float)texShapes.height);
              __x = local_17c * 0.017453292;
              fVar10 = cosf(__x);
              fVar11 = sinf(__x);
              rlVertex2f(fVar10 * fVar15 + fVar1,fVar11 * fVar15 + fVar2);
              rlTexCoord2f(local_178 / (float)texShapes.width,fVar13 / (float)texShapes.height);
              local_17c = local_17c + 90.0 / (float)segments;
              fVar10 = local_17c * 0.017453292;
              fVar11 = cosf(fVar10);
              fVar12 = sinf(fVar10);
              rlVertex2f(fVar11 * fVar15 + fVar1,fVar12 * fVar15 + fVar2);
              rlTexCoord2f(local_178 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
              fVar11 = cosf(fVar10);
              fVar10 = sinf(fVar10);
              rlVertex2f(fVar11 * fVar8 + fVar1,fVar10 * fVar8 + fVar2);
              rlTexCoord2f(local_168 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
              fVar10 = cosf(__x);
              fVar11 = sinf(__x);
              rlVertex2f(fVar10 * fVar8 + fVar1,fVar11 * fVar8 + fVar2);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        rlColor4ub(x,y,z,w);
        rlTexCoord2f(local_168 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(fVar9,y_00);
        rlTexCoord2f(local_168 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_98,local_94);
        rlTexCoord2f(local_178 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_90,local_8c);
        rlTexCoord2f(local_178 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(fVar14,y_00);
        rlColor4ub(x,y,z,w);
        rlTexCoord2f(local_168 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(local_c8[0],local_c8[1]);
        rlTexCoord2f(local_168 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_88,local_84);
        rlTexCoord2f(local_178 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_80,local_7c);
        rlTexCoord2f(local_178 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(local_c8[2],local_c8[3]);
        rlColor4ub(x,y,z,w);
        rlTexCoord2f(local_168 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(local_70,local_6c);
        rlTexCoord2f(local_168 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_b0,local_ac);
        rlTexCoord2f(local_178 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_b8,local_b4);
        rlTexCoord2f(local_178 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(local_78,local_74);
        rlColor4ub(x,y,z,w);
        rlTexCoord2f(local_168 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(local_60,local_5c);
        rlTexCoord2f(local_168 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_a0,local_9c);
        rlTexCoord2f(local_178 / (float)texShapes.width,fStack_174 / (float)texShapes.height);
        rlVertex2f(local_a8,local_a4);
        rlTexCoord2f(local_178 / (float)texShapes.width,fVar13 / (float)texShapes.height);
        rlVertex2f(local_68,local_64);
        rlEnd();
        rlSetTexture(0);
      }
    }
    return;
  }
  rec_00.x = local_68 - fVar13;
  rec_00.width = fVar13 + fVar13 + local_88;
  rec_00.y = local_94 - fVar13;
  rec_00.height = local_74 + fVar13 + fVar13;
  DrawRectangleLinesEx(rec_00,fVar13,color);
  return;
}

Assistant:

void DrawRectangleRoundedLinesEx(Rectangle rec, float roundness, int segments, float lineThick, Color color)
{
    if (lineThick < 0) lineThick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        DrawRectangleLinesEx((Rectangle){rec.x-lineThick, rec.y-lineThick, rec.width+2*lineThick, rec.height+2*lineThick}, lineThick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)(ceilf(2*PI/th)/2.0f);
        if (segments <= 0) segments = 4;
    }

    float stepLength = 90.0f/(float)segments;
    const float outerRadius = radius + lineThick, innerRadius = radius;

    /*
    Quick sketch to make sense of all of this,
    marks the 16 + 4(corner centers P16-19) points we'll use

           P0 ================== P1
          // P8                P9 \\
         //                        \\
     P7 // P15                  P10 \\ P2
       ||   *P16             P17*    ||
       ||                            ||
       || P14                   P11  ||
     P6 \\  *P19             P18*   // P3
         \\                        //
          \\ P13              P12 //
           P5 ================== P4
    */
    const Vector2 point[16] = {
        {(float)rec.x + innerRadius, rec.y - lineThick}, {(float)(rec.x + rec.width) - innerRadius, rec.y - lineThick}, { rec.x + rec.width + lineThick, (float)rec.y + innerRadius }, // PO, P1, P2
        {rec.x + rec.width + lineThick, (float)(rec.y + rec.height) - innerRadius}, {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height + lineThick}, // P3, P4
        {(float)rec.x + innerRadius, rec.y + rec.height + lineThick}, { rec.x - lineThick, (float)(rec.y + rec.height) - innerRadius}, {rec.x - lineThick, (float)rec.y + innerRadius}, // P5, P6, P7
        {(float)rec.x + innerRadius, rec.y}, {(float)(rec.x + rec.width) - innerRadius, rec.y}, // P8, P9
        { rec.x + rec.width, (float)rec.y + innerRadius }, {rec.x + rec.width, (float)(rec.y + rec.height) - innerRadius}, // P10, P11
        {(float)(rec.x + rec.width) - innerRadius, rec.y + rec.height}, {(float)rec.x + innerRadius, rec.y + rec.height}, // P12, P13
        { rec.x, (float)(rec.y + rec.height) - innerRadius}, {rec.x, (float)rec.y + innerRadius} // P14, P15
    };

    const Vector2 centers[4] = {
        {(float)rec.x + innerRadius, (float)rec.y + innerRadius}, {(float)(rec.x + rec.width) - innerRadius, (float)rec.y + innerRadius}, // P16, P17
        {(float)(rec.x + rec.width) - innerRadius, (float)(rec.y + rec.height) - innerRadius}, {(float)rec.x + innerRadius, (float)(rec.y + rec.height) - innerRadius} // P18, P19
    };

    const float angles[4] = { 180.0f, 270.0f, 0.0f, 90.0f };

    if (lineThick > 1)
    {
#if defined(SUPPORT_QUADS_DRAW_MODE)
        rlSetTexture(GetShapesTexture().id);
        Rectangle shapeRect = GetShapesTextureRectangle();

        rlBegin(RL_QUADS);

            // Draw all the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];
                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);

                    rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);

                    rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);

                    rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);

                    rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[0].x, point[0].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[8].x, point[8].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[9].x, point[9].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[1].x, point[1].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[2].x, point[2].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[10].x, point[10].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[11].x, point[11].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[13].x, point[13].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[5].x, point[5].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[4].x, point[4].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[12].x, point[12].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[15].x, point[15].y);
            rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[7].x, point[7].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
            rlVertex2f(point[6].x, point[6].y);
            rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
            rlVertex2f(point[14].x, point[14].y);

        rlEnd();
        rlSetTexture(0);
#else
        rlBegin(RL_TRIANGLES);

            // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);

                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);

                    angle += stepLength;
                }
            }

            // Upper rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[8].x, point[8].y);
            rlVertex2f(point[9].x, point[9].y);
            rlVertex2f(point[1].x, point[1].y);
            rlVertex2f(point[0].x, point[0].y);
            rlVertex2f(point[9].x, point[9].y);

            // Right rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[11].x, point[11].y);
            rlVertex2f(point[3].x, point[3].y);
            rlVertex2f(point[2].x, point[2].y);
            rlVertex2f(point[10].x, point[10].y);
            rlVertex2f(point[3].x, point[3].y);

            // Lower rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[5].x, point[5].y);
            rlVertex2f(point[4].x, point[4].y);
            rlVertex2f(point[12].x, point[12].y);
            rlVertex2f(point[13].x, point[13].y);
            rlVertex2f(point[4].x, point[4].y);

            // Left rectangle
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[6].x, point[6].y);
            rlVertex2f(point[14].x, point[14].y);
            rlVertex2f(point[15].x, point[15].y);
            rlVertex2f(point[7].x, point[7].y);
            rlVertex2f(point[14].x, point[14].y);
        rlEnd();
#endif
    }
    else
    {
        // Use LINES to draw the outline
        rlBegin(RL_LINES);

            // Draw all the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
            for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
            {
                float angle = angles[k];
                const Vector2 center = centers[k];

                for (int i = 0; i < segments; i++)
                {
                    rlColor4ub(color.r, color.g, color.b, color.a);
                    rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
                    rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);
                    angle += stepLength;
                }
            }

            // And now the remaining 4 lines
            for (int i = 0; i < 8; i += 2)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlVertex2f(point[i].x, point[i].y);
                rlVertex2f(point[i + 1].x, point[i + 1].y);
            }

        rlEnd();
    }
}